

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

size_t __thiscall Memory::Recycler::RootMark(Recycler *this,CollectionState markState)

{
  undefined4 *puVar1;
  ObservableValueObserver<Memory::CollectionState> *pOVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  size_t sVar6;
  size_t sVar7;
  undefined8 *in_FS_OFFSET;
  Recycler *local_38;
  RecyclerScanMemoryCallback scanMemory;
  BOOL stacksScannedByRuntime;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  if ((markState != CollectionStateRescanMark) && (this->needOOMRescan != false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa82,"(!this->NeedOOMRescan() || markState == CollectionStateRescanMark)",
                       "!this->NeedOOMRescan() || markState == CollectionStateRescanMark");
    if (!bVar4) goto LAB_0026a126;
    *puVar1 = 0;
  }
  if (this->recyclerFlagsTable->Verbose == true) {
    bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
    if (bVar4) {
      Output::Print(L"PreMark done, partial collect: %d\n",(ulong)this->inPartialCollectMode);
    }
  }
  if ((this->collectionState).value !=
      ((uint)(markState != CollectionStateMark) << 6 | CollectionStateFindRoots)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa89,
                       "(collectionState == (markState == CollectionStateMark? CollectionStateFindRoots : CollectionStateRescanFindRoots))"
                       ,
                       "collectionState == (markState == CollectionStateMark? CollectionStateFindRoots : CollectionStateRescanFindRoots)"
                      );
    if (!bVar4) {
LAB_0026a126:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  scanMemory.recycler._0_4_ = 0;
  AutoFilterExceptionRegion::AutoFilterExceptionRegion
            ((AutoFilterExceptionRegion *)((long)&scanMemory.recycler + 4),ExceptionType_All);
  local_38 = this;
  iVar5 = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[3])
                    (this->collectionWrapper,&local_38,&scanMemory);
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion
            ((AutoFilterExceptionRegion *)((long)&scanMemory.recycler + 4));
  sVar6 = FindRoots(this);
  sVar6 = sVar6 + CONCAT44(extraout_var,iVar5);
  if ((int)scanMemory.recycler == 0) {
    sVar7 = ScanStack(this);
    sVar6 = sVar6 + sVar7;
  }
  local_38 = (Recycler *)CONCAT44(local_38._4_4_,markState);
  pOVar2 = (this->collectionState).observer;
  if ((pOVar2 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((this->collectionState).value != markState)) {
    (**pOVar2->_vptr_ObservableValueObserver)(pOVar2,&local_38,&this->collectionState);
    markState = (CollectionState)local_38;
  }
  (this->collectionState).value = markState;
  if (this->enableParallelMark == true) {
    DoParallelMark(this);
  }
  else {
    ProcessMark(this,false);
  }
  bVar4 = EndMark(this);
  if (bVar4) {
    sVar6 = 0x500001;
  }
  return sVar6;
}

Assistant:

size_t
Recycler::RootMark(CollectionState markState)
{
    size_t scannedRootBytes = 0;
    Assert(!this->NeedOOMRescan() || markState == CollectionStateRescanMark);
#if ENABLE_PARTIAL_GC
    RecyclerVerboseTrace(GetRecyclerFlagsTable(), _u("PreMark done, partial collect: %d\n"), this->inPartialCollectMode);
#else
    RecyclerVerboseTrace(GetRecyclerFlagsTable(), _u("PreMark done, partial collect not available\n"));
#endif

    Assert(collectionState == (markState == CollectionStateMark? CollectionStateFindRoots : CollectionStateRescanFindRoots));

    BOOL stacksScannedByRuntime = FALSE;
    {
        // We are about to scan roots in thread, notify the runtime first so it can stop threads if necessary and also provide additional roots
        AUTO_NO_EXCEPTION_REGION;
        RecyclerScanMemoryCallback scanMemory(this);
        scannedRootBytes += collectionWrapper->RootMarkCallback(scanMemory, &stacksScannedByRuntime);
    }

    scannedRootBytes += FindRoots();

    if (!stacksScannedByRuntime)
    {
        // The runtime did not scan the stack(s) for us, so we use the normal Recycler code.
        scannedRootBytes += ScanStack();
    }

    this->SetCollectionState(markState);

#if ENABLE_CONCURRENT_GC
    if (this->enableParallelMark)
    {
        this->DoParallelMark();
    }
    else
#endif
    {
        this->ProcessMark(false);
    }

    if (this->EndMark())
    {
        // REVIEW: This heuristic doesn't apply when partial is off so there's no need
        // to modify scannedRootBytes here, correct?
#if ENABLE_PARTIAL_GC
        // return large root scanned byte to not get into partial mode if we are low on memory
        scannedRootBytes = RecyclerSweepManager::MaxPartialCollectRescanRootBytes + 1;
#endif
    }

    return scannedRootBytes;
}